

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode curl_mime_data_cb(curl_mimepart *part,curl_off_t datasize,curl_read_callback readfunc,
                          curl_seek_callback seekfunc,curl_free_callback freefunc,void *arg)

{
  if (part != (curl_mimepart *)0x0) {
    if (part->freefunc != (curl_free_callback)0x0) {
      (*part->freefunc)(part->arg);
    }
    part->readfunc = (curl_read_callback)0x0;
    part->seekfunc = (curl_seek_callback)0x0;
    part->freefunc = (curl_free_callback)0x0;
    part->arg = part;
    part->data = (char *)0x0;
    part->fp = (FILE *)0x0;
    part->datasize = 0;
    (part->encstate).pos = 0;
    (part->encstate).bufbeg = 0;
    (part->encstate).bufend = 0;
    part->kind = MIMEKIND_NONE;
    if (readfunc != (curl_read_callback)0x0) {
      part->readfunc = readfunc;
      part->seekfunc = seekfunc;
      part->freefunc = freefunc;
      part->arg = arg;
      part->datasize = datasize;
      part->kind = MIMEKIND_CALLBACK;
    }
    return CURLE_OK;
  }
  return CURLE_BAD_FUNCTION_ARGUMENT;
}

Assistant:

CURLcode curl_mime_data_cb(curl_mimepart *part, curl_off_t datasize,
                           curl_read_callback readfunc,
                           curl_seek_callback seekfunc,
                           curl_free_callback freefunc, void *arg)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  cleanup_part_content(part);

  if(readfunc) {
    part->readfunc = readfunc;
    part->seekfunc = seekfunc;
    part->freefunc = freefunc;
    part->arg = arg;
    part->datasize = datasize;
    part->kind = MIMEKIND_CALLBACK;
  }

  return CURLE_OK;
}